

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

void amrex::VisMF::CloseStream(string *fileName,bool forceClose)

{
  mapped_type *pmVar1;
  byte in_SIL;
  PersistentIFStream *pifs;
  undefined7 in_stack_00000018;
  
  if (((usePersistentIFStreams & 1) == 0) || ((in_SIL & 1) != 0)) {
    pmVar1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::VisMF::PersistentIFStream>_>_>
                           *)fileName,(key_type *)CONCAT17(forceClose,in_stack_00000018));
    if ((pmVar1->isOpen & 1U) != 0) {
      std::ifstream::close();
      if (pmVar1->pstr != (ifstream *)0x0) {
        (**(code **)(*(long *)pmVar1->pstr + 8))();
      }
      pmVar1->pstr = (ifstream *)0x0;
      pmVar1->isOpen = false;
    }
    std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0xf813c3)
    ;
  }
  return;
}

Assistant:

void VisMF::CloseStream(const std::string &fileName, bool forceClose)
{
  if(usePersistentIFStreams && ! forceClose) {
    return;
  }

  VisMF::PersistentIFStream &pifs = VisMF::persistentIFStreams[fileName];
  if(pifs.isOpen) {
    pifs.pstr->close();
    delete pifs.pstr;
    pifs.pstr = 0;
    pifs.isOpen = false;
  }
  pifs.ioBuffer.clear();
}